

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifAig.c
# Opt level: O0

int Io_BlifEstimateAndNum(Io_BlifMan_t *p)

{
  Io_BlifObj_t *pIVar1;
  size_t sVar2;
  int local_2c;
  int local_28;
  int Counter;
  int CounterOne;
  int i;
  char *pCur;
  Io_BlifObj_t *pObj;
  Io_BlifMan_t *p_local;
  
  local_2c = 0;
  for (Counter = 0; Counter < p->iObjNext; Counter = Counter + 1) {
    pIVar1 = p->pObjects + Counter;
    if ((*(uint *)pIVar1 >> 4 & 1) != 0) {
      local_28 = 0;
      _CounterOne = pIVar1->pName;
      sVar2 = strlen(pIVar1->pName);
      for (_CounterOne = _CounterOne + sVar2; *_CounterOne != '.'; _CounterOne = _CounterOne + 1) {
        if ((*_CounterOne == '0') || (*_CounterOne == '1')) {
          local_28 = local_28 + 1;
        }
      }
      if (local_28 != 0) {
        local_2c = local_28 + -1 + local_2c;
      }
    }
  }
  return local_2c;
}

Assistant:

static int Io_BlifEstimateAndNum( Io_BlifMan_t * p )
{
    Io_BlifObj_t * pObj;
    char * pCur;
    int i, CounterOne, Counter = 0;
    for ( i = 0; i < p->iObjNext; i++ )
    {
        pObj = p->pObjects + i;
        if ( !pObj->fDef )
            continue;
        CounterOne = 0;
        for ( pCur = pObj->pName + strlen(pObj->pName); *pCur != '.'; pCur++ )
            if ( *pCur == '0' || *pCur == '1' )
                CounterOne++;
        if ( CounterOne )
            Counter += CounterOne - 1;
    }
    return Counter;
}